

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_5.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  exception *e;
  int i;
  Date local_18;
  Date d;
  
  d.days._4_4_ = 0;
  Date::Date(&local_18,0x7e4,feb,0x1d);
  poVar1 = operator<<((ostream *)&std::cout,&local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (e._0_4_ = 1; (int)e < 6; e._0_4_ = (int)e + 1) {
    Date::add_year(&local_18,1);
    poVar1 = operator<<((ostream *)&std::cout,&local_18);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
	try
	{
		Date d{ 2020, Month::feb, 29 };
		std::cout << d << std::endl;
		for (auto i = 1; i <= 5; ++i)
		{
			d.add_year(1);
			std::cout << d << std::endl;
		}
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}